

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O0

void ie_pack(vmd_bst_node_t *head,int in_tree,vmd_bst_node_t **pack)

{
  vmd_bst_node_t **ppvVar1;
  vmd_bst_node_t **local_20;
  vmd_bst_node_t **pack_local;
  vmd_bst_node_t *pvStack_10;
  int in_tree_local;
  vmd_bst_node_t *head_local;
  
  local_20 = pack;
  for (pvStack_10 = head; pvStack_10 != (vmd_bst_node_t *)0x0; pvStack_10 = pvStack_10->next) {
    if ((uint)((byte)pvStack_10->field_0x20 >> 4 & 1) == in_tree) {
      ppvVar1 = local_20 + 1;
      *local_20 = pvStack_10;
      local_20 = ppvVar1;
      if ((((byte)pvStack_10->field_0x20 >> 6 & 1) == 0) || (in_tree != 0)) {
        pvStack_10->field_0x20 = pvStack_10->field_0x20 & 0xbf;
      }
    }
    pvStack_10->field_0x20 = pvStack_10->field_0x20 & 0xdf;
  }
  return;
}

Assistant:

static void
ie_pack(bst_node_t *head, int in_tree, bst_node_t **pack)
{
	for (; head != NULL; head = head->next) {
		if (head->in_tree == in_tree) {
			*pack++ = head;
			if (head->saved && !in_tree)
				; //node was changed and erased; need to restore it
			else
				head->saved = 0;
		}
		head->inserted = 0;
	}
}